

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

int Pdr_ManPushClauses(Pdr_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Pdr_Set_t *pPVar7;
  void *pvVar8;
  uint uVar9;
  Vec_Vec_t *pVVar10;
  long lVar11;
  int k;
  ulong uVar12;
  uint uVar13;
  int k_00;
  uint uVar14;
  size_t sVar15;
  uint uVar16;
  Pdr_Set_t *pPVar17;
  uint uVar18;
  ulong uVar19;
  timespec ts;
  long local_58;
  timespec local_50;
  ulong local_40;
  ulong local_38;
  
  if (p->pPars->fShiftStart == 0) {
    uVar14 = 1;
  }
  else {
    uVar14 = p->iUseFrame;
  }
  uVar16 = p->vSolvers->nSize;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_58 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->iUseFrame < 1) {
    __assert_fail("p->iUseFrame > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                  ,0x9d,"int Pdr_ManPushClauses(Pdr_Man_t *)");
  }
  uVar5 = uVar16 - 1;
  iVar4 = 0;
  local_40 = (ulong)uVar16;
  if ((int)uVar14 < (int)uVar5) {
    uVar12 = (ulong)uVar14;
    iVar4 = 0;
    while (-1 < (int)uVar14) {
      pVVar10 = p->vClauses;
      iVar6 = pVVar10->nSize;
      k_00 = (int)uVar12;
      if (iVar6 <= k_00) break;
      pvVar2 = pVVar10->pArray[uVar12];
      if (1 < (long)*(int *)((long)pvVar2 + 4)) {
        qsort(*(void **)((long)pvVar2 + 8),(long)*(int *)((long)pvVar2 + 4),8,Pdr_SetCompare);
        pVVar10 = p->vClauses;
        iVar6 = pVVar10->nSize;
      }
      uVar12 = uVar12 + 1;
      k = (int)uVar12;
      if (iVar6 <= k) break;
      iVar6 = *(int *)((long)pvVar2 + 4);
      if (0 < iVar6) {
        puVar3 = (uint *)pVVar10->pArray[uVar12];
        uVar16 = 0;
        do {
          if ((int)uVar16 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          local_38 = (ulong)uVar16;
          pPVar17 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + local_38 * 8);
          uVar9 = uVar16 + 1;
          uVar18 = uVar9;
          uVar13 = uVar16;
          if ((int)uVar9 < iVar6) {
            do {
              pPVar7 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + (ulong)uVar18 * 8);
              iVar6 = Pdr_SetContains(pPVar7,pPVar17);
              if (iVar6 == 0) {
                iVar6 = *(int *)((long)pvVar2 + 4);
                uVar13 = uVar18;
              }
              else {
                Pdr_SetDeref(pPVar7);
                uVar1 = *(uint *)((long)pvVar2 + 4);
                if ((long)(int)uVar1 < 1) goto LAB_005f2774;
                if (uVar1 <= uVar18) goto LAB_005f2755;
                *(undefined8 *)(*(long *)((long)pvVar2 + 8) + (ulong)uVar18 * 8) =
                     *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)(int)uVar1 * 8);
                iVar6 = uVar1 - 1;
                *(int *)((long)pvVar2 + 4) = iVar6;
              }
              uVar18 = uVar13 + 1;
            } while ((int)(uVar13 + 1) < iVar6);
          }
          iVar6 = Pdr_ManCheckCube(p,k_00,pPVar17,(Pdr_Set_t **)0x0,0,0,1);
          if (iVar6 == 0) {
            iVar6 = *(int *)((long)pvVar2 + 4);
            uVar16 = uVar9;
          }
          else {
            if (iVar6 == -1) {
              return -1;
            }
            pPVar7 = Pdr_ManReduceClause(p,k_00,pPVar17);
            if (pPVar7 != (Pdr_Set_t *)0x0) {
              Pdr_SetDeref(pPVar17);
              pPVar17 = pPVar7;
            }
            Pdr_ManSolverAddClause(p,k,pPVar17);
            uVar18 = puVar3[1];
            if (0 < (int)uVar18) {
              uVar13 = 0;
              do {
                pPVar7 = *(Pdr_Set_t **)(*(long *)(puVar3 + 2) + (ulong)uVar13 * 8);
                iVar6 = Pdr_SetContains(pPVar7,pPVar17);
                if (iVar6 == 0) {
                  uVar18 = puVar3[1];
                  uVar13 = uVar13 + 1;
                }
                else {
                  Pdr_SetDeref(pPVar7);
                  uVar18 = puVar3[1];
                  if ((long)(int)uVar18 < 1) goto LAB_005f2774;
                  if (uVar18 <= uVar13) goto LAB_005f2755;
                  *(undefined8 *)(*(long *)(puVar3 + 2) + (ulong)uVar13 * 8) =
                       *(undefined8 *)(*(long *)(puVar3 + 2) + -8 + (long)(int)uVar18 * 8);
                  uVar18 = uVar18 - 1;
                  puVar3[1] = uVar18;
                }
              } while ((int)uVar13 < (int)uVar18);
            }
            if (uVar18 == *puVar3) {
              if ((int)uVar18 < 0x10) {
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar8 = malloc(0x80);
                }
                else {
                  pvVar8 = realloc(*(void **)(puVar3 + 2),0x80);
                }
                *(void **)(puVar3 + 2) = pvVar8;
                *puVar3 = 0x10;
              }
              else {
                sVar15 = (ulong)(uVar18 * 2) * 8;
                if (*(void **)(puVar3 + 2) == (void *)0x0) {
                  pvVar8 = malloc(sVar15);
                }
                else {
                  pvVar8 = realloc(*(void **)(puVar3 + 2),sVar15);
                }
                *(void **)(puVar3 + 2) = pvVar8;
                *puVar3 = uVar18 * 2;
              }
            }
            else {
              pvVar8 = *(void **)(puVar3 + 2);
            }
            uVar18 = puVar3[1];
            puVar3[1] = uVar18 + 1;
            *(Pdr_Set_t **)((long)pvVar8 + (long)(int)uVar18 * 8) = pPVar17;
            iVar6 = *(int *)((long)pvVar2 + 4);
            if ((long)iVar6 < 1) goto LAB_005f2774;
            if (iVar6 <= (int)uVar16) goto LAB_005f2755;
            *(undefined8 *)(*(long *)((long)pvVar2 + 8) + local_38 * 8) =
                 *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)iVar6 * 8);
            iVar6 = iVar6 + -1;
            *(int *)((long)pvVar2 + 4) = iVar6;
          }
        } while ((int)uVar16 < iVar6);
      }
      if (iVar6 == 0) {
        iVar4 = 1;
      }
      if ((int)uVar5 <= k) goto LAB_005f261d;
    }
  }
  else {
LAB_005f261d:
    if ((0 < (int)local_40) && ((int)local_40 <= p->vClauses->nSize)) {
      pvVar2 = p->vClauses->pArray[uVar5];
      sVar15 = (size_t)*(int *)((long)pvVar2 + 4);
      if (1 < (long)sVar15) {
        qsort(*(void **)((long)pvVar2 + 8),sVar15,8,Pdr_SetCompare);
        sVar15 = (size_t)*(uint *)((long)pvVar2 + 4);
      }
      if (0 < (int)sVar15) {
        uVar12 = 0;
        do {
          uVar19 = uVar12 + 1;
          lVar11 = (long)(int)sVar15;
          if ((long)uVar19 < lVar11) {
            pPVar17 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + uVar12 * 8);
            uVar12 = uVar19 & 0xffffffff;
            do {
              pPVar7 = *(Pdr_Set_t **)(*(long *)((long)pvVar2 + 8) + uVar12 * 8);
              iVar6 = Pdr_SetContains(pPVar7,pPVar17);
              if (iVar6 == 0) {
                uVar14 = *(uint *)((long)pvVar2 + 4);
                uVar12 = (ulong)((uint)uVar12 + 1);
              }
              else {
                Pdr_SetDeref(pPVar7);
                uVar14 = *(uint *)((long)pvVar2 + 4);
                if ((long)(int)uVar14 < 1) {
LAB_005f2774:
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
                }
                if (uVar14 <= (uint)uVar12) {
LAB_005f2755:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                *(undefined8 *)(*(long *)((long)pvVar2 + 8) + uVar12 * 8) =
                     *(undefined8 *)(*(long *)((long)pvVar2 + 8) + -8 + (long)(int)uVar14 * 8);
                uVar14 = uVar14 - 1;
                *(uint *)((long)pvVar2 + 4) = uVar14;
              }
              sVar15 = (size_t)uVar14;
            } while ((int)uVar12 < (int)uVar14);
            lVar11 = (long)(int)uVar14;
          }
          uVar12 = uVar19;
        } while ((long)uVar19 < lVar11);
      }
      iVar6 = clock_gettime(3,&local_50);
      if (iVar6 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      p->tPush = p->tPush + lVar11 + local_58;
      return iVar4;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

int Pdr_ManPushClauses( Pdr_Man_t * p )
{
    Pdr_Set_t * pTemp, * pCubeK, * pCubeK1;
    Vec_Ptr_t * vArrayK, * vArrayK1;
    int i, j, k, m, RetValue = 0, RetValue2, kMax = Vec_PtrSize(p->vSolvers)-1;
    int iStartFrame = p->pPars->fShiftStart ? p->iUseFrame : 1;
    int Counter = 0;
    abctime clk = Abc_Clock();
    assert( p->iUseFrame > 0 );
    Vec_VecForEachLevelStartStop( p->vClauses, vArrayK, k, iStartFrame, kMax )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        vArrayK1 = Vec_VecEntry( p->vClauses, k+1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
        {
            Counter++;

            // remove cubes in the same frame that are contained by pCubeK
            Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
            {
                if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                    continue;
                Pdr_SetDeref( pTemp );
                Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
                Vec_PtrPop(vArrayK);
                m--;
            }

            // check if the clause can be moved to the next frame
            RetValue2 = Pdr_ManCheckCube( p, k, pCubeK, NULL, 0, 0, 1 );
            if ( RetValue2 == -1 )
                return -1;
            if ( !RetValue2 )
                continue;

            {
                Pdr_Set_t * pCubeMin;
                pCubeMin = Pdr_ManReduceClause( p, k, pCubeK );
                if ( pCubeMin != NULL )
                {
//                Abc_Print( 1, "%d ", pCubeK->nLits - pCubeMin->nLits );
                    Pdr_SetDeref( pCubeK );
                    pCubeK = pCubeMin;
                }
            }

            // if it can be moved, add it to the next frame
            Pdr_ManSolverAddClause( p, k+1, pCubeK );
            // check if the clause subsumes others
            Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK1, pCubeK1, i )
            {
                if ( !Pdr_SetContains( pCubeK1, pCubeK ) ) // pCubeK contains pCubeK1
                    continue;
                Pdr_SetDeref( pCubeK1 );
                Vec_PtrWriteEntry( vArrayK1, i, Vec_PtrEntryLast(vArrayK1) );
                Vec_PtrPop(vArrayK1);
                i--;
            }
            // add the last clause
            Vec_PtrPush( vArrayK1, pCubeK );
            Vec_PtrWriteEntry( vArrayK, j, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            j--;
        }
        if ( Vec_PtrSize(vArrayK) == 0 )
            RetValue = 1;
    }

    // clean up the last one
    vArrayK = Vec_VecEntry( p->vClauses, kMax );
    Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
    Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCubeK, j )
    {
        // remove cubes in the same frame that are contained by pCubeK
        Vec_PtrForEachEntryStart( Pdr_Set_t *, vArrayK, pTemp, m, j+1 )
        {
            if ( !Pdr_SetContains( pTemp, pCubeK ) ) // pCubeK contains pTemp
                continue;
/*
            Abc_Print( 1, "===\n" );
            Pdr_SetPrint( stdout, pCubeK, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
            Pdr_SetPrint( stdout, pTemp, Aig_ManRegNum(p->pAig), NULL );
            Abc_Print( 1, "\n" );
*/
            Pdr_SetDeref( pTemp );
            Vec_PtrWriteEntry( vArrayK, m, Vec_PtrEntryLast(vArrayK) );
            Vec_PtrPop(vArrayK);
            m--;
        }
    }
    p->tPush += Abc_Clock() - clk;
    return RetValue;
}